

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O0

void DivVerifyInt64Uint32_2(void)

{
  bool bVar1;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar2;
  TestCase<long,_unsigned_int,_2> TVar3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  TestCase<long,_unsigned_int,_2> test;
  TestVector<long,_unsigned_int,_2> tests;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  bool bStack_9c;
  TestCase<long,_unsigned_int,_2> local_a8;
  allocator local_81;
  string local_80 [56];
  uint local_48;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_44;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint local_20;
  byte local_1c;
  TestVector<long,_unsigned_int,_2> local_18;
  
  TestVector<long,_unsigned_int,_2>::TestVector(&local_18);
  TVar3 = TestVector<long,_unsigned_int,_2>::GetNext
                    ((TestVector<long,_unsigned_int,_2> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_1c = TVar3.fExpected;
  local_20 = TVar3.y;
  while( true ) {
    bVar1 = TestVector<long,_unsigned_int,_2>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffc4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)&stack0xffffffffffffffc0,&local_20);
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_44);
    SVar2 = operator/(local_a8.x,SVar2);
    local_48 = SVar2.m_int;
    local_44 = SVar2;
    if (((byte)(in_stack_ffffffffffffffc4 >> 0x18) & 1) != (local_1c & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"Error in case int64_uint32_2 throw: ",&local_81);
      err_msg<long,unsigned_int>
                (TVar3._8_8_,TVar3.x,in_stack_ffffffffffffffc4,
                 SUB41(in_stack_ffffffffffffffc0.m_int >> 0x18,0));
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    local_a8 = TestVector<long,_unsigned_int,_2>::GetNext
                         ((TestVector<long,_unsigned_int,_2> *)
                          CONCAT44(SVar2.m_int,in_stack_ffffffffffffff48));
    local_1c = bStack_9c;
    local_20 = SVar2.m_int;
  }
  return;
}

Assistant:

void DivVerifyInt64Uint32_2()
{
    TestVector< std::int64_t, std::uint32_t, OpType::Div2 > tests;
    TestCase< std::int64_t, std::uint32_t, OpType::Div2 > test = tests.GetNext();

    while (!tests.Done())
    {
      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::uint32_t> si(test.y);
         SafeInt<std::uint32_t> si2;

         si2 = test.x / si;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
         err_msg( "Error in case int64_uint32_2 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}